

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O2

int mbedtls_sha512_self_test(int verbose)

{
  uchar *input;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  mbedtls_sha512_context local_158;
  uchar sha512sum [64];
  
  input = (uchar *)calloc(0x400,1);
  if (input == (uchar *)0x0) {
    iVar1 = 1;
    if (verbose != 0) {
      puts("Buffer allocation failed");
    }
  }
  else {
    memset(&local_158,0,0xd8);
    for (uVar3 = 0; uVar3 != 6; uVar3 = uVar3 + 1) {
      uVar2 = (uint)uVar3 - 3;
      if (uVar3 < 3) {
        uVar2 = (uint)uVar3;
      }
      if (verbose != 0) {
        printf("  SHA-%d test #%d: ",(ulong)((uint)(2 < uVar3) * 0x80 + 0x180),(ulong)(uVar2 + 1));
      }
      local_158.total[0] = 0;
      local_158.total[1] = 0;
      local_158.state[0]._0_4_ = 0xf3bcc908;
      local_158.state[0]._4_4_ = 0x6a09e667;
      local_158.state[1]._0_4_ = 0x84caa73b;
      local_158.state[1]._4_4_ = 0xbb67ae85;
      local_158.state[2]._0_4_ = 0xfe94f82b;
      local_158.state[2]._4_4_ = 0x3c6ef372;
      local_158.state[3]._0_4_ = 0x5f1d36f1;
      local_158.state[3]._4_4_ = 0xa54ff53a;
      local_158.state[4]._0_4_ = 0xade682d1;
      local_158.state[4]._4_4_ = 0x510e527f;
      local_158.state[5]._0_4_ = 0x2b3e6c1f;
      local_158.state[5]._4_4_ = 0x9b05688c;
      local_158.state[6]._0_4_ = 0xfb41bd6b;
      local_158.state[6]._4_4_ = 0x1f83d9ab;
      local_158.state[7]._0_4_ = 0x137e2179;
      local_158.state[7]._4_4_ = 0x5be0cd19;
      if (uVar3 < 3) {
        local_158.state[0]._0_4_ = 0xc1059ed8;
        local_158.state[0]._4_4_ = 0xcbbb9d5d;
        local_158.state[1]._0_4_ = 0x367cd507;
        local_158.state[1]._4_4_ = 0x629a292a;
        local_158.state[2]._0_4_ = 0x3070dd17;
        local_158.state[2]._4_4_ = 0x9159015a;
        local_158.state[3]._0_4_ = 0xf70e5939;
        local_158.state[3]._4_4_ = 0x152fecd8;
        local_158.state[4]._0_4_ = 0xffc00b31;
        local_158.state[4]._4_4_ = 0x67332667;
        local_158.state[5]._0_4_ = 0x68581511;
        local_158.state[5]._4_4_ = 0x8eb44a87;
        local_158.state[6]._0_4_ = 0x64f98fa7;
        local_158.state[6]._4_4_ = 0xdb0c2e0d;
        local_158.state[7]._0_4_ = 0xbefa4fa4;
        local_158.state[7]._4_4_ = 0x47b5481d;
      }
      local_158.is384 = (int)(uVar3 < 3);
      if (uVar2 == 2) {
        memset(input,0x61,1000);
        iVar1 = 1000;
        while (bVar4 = iVar1 != 0, iVar1 = iVar1 + -1, bVar4) {
          mbedtls_sha512_update(&local_158,input,1000);
        }
      }
      else {
        mbedtls_sha512_update(&local_158,sha512_test_buf[uVar2],(long)sha512_test_buflen[uVar2]);
      }
      mbedtls_sha512_finish(&local_158,sha512sum);
      iVar1 = bcmp(sha512sum,sha512_test_sum + uVar3,(ulong)(2 < uVar3) * 0x10 + 0x30);
      if (iVar1 != 0) {
        iVar1 = 1;
        if (verbose != 0) {
          puts("failed");
        }
        goto LAB_00124564;
      }
      if (verbose != 0) {
        puts("passed");
      }
    }
    iVar1 = 0;
    if (verbose != 0) {
      putchar(10);
      iVar1 = 0;
    }
LAB_00124564:
    mbedtls_sha512_free(&local_158);
    free(input);
  }
  return iVar1;
}

Assistant:

int mbedtls_sha512_self_test( int verbose )
{
    int i, j, k, buflen, ret = 0;
    unsigned char *buf;
    unsigned char sha512sum[64];
    mbedtls_sha512_context ctx;

    buf = mbedtls_calloc( 1024, sizeof(unsigned char) );
    if( NULL == buf )
    {
        if( verbose != 0 )
            mbedtls_printf( "Buffer allocation failed\n" );

        return( 1 );
    }

    mbedtls_sha512_init( &ctx );

    for( i = 0; i < 6; i++ )
    {
        j = i % 3;
        k = i < 3;

        if( verbose != 0 )
            mbedtls_printf( "  SHA-%d test #%d: ", 512 - k * 128, j + 1 );

        mbedtls_sha512_starts( &ctx, k );

        if( j == 2 )
        {
            memset( buf, 'a', buflen = 1000 );

            for( j = 0; j < 1000; j++ )
                mbedtls_sha512_update( &ctx, buf, buflen );
        }
        else
            mbedtls_sha512_update( &ctx, sha512_test_buf[j],
                                 sha512_test_buflen[j] );

        mbedtls_sha512_finish( &ctx, sha512sum );

        if( memcmp( sha512sum, sha512_test_sum[i], 64 - k * 16 ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

exit:
    mbedtls_sha512_free( &ctx );
    mbedtls_free( buf );

    return( ret );
}